

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerMSL::emit_glsl_op
          (CompilerMSL *this,uint32_t result_type,uint32_t id,uint32_t eop,uint32_t *args,
          uint32_t count)

{
  float fVar1;
  bool bVar2;
  uint32_t uVar3;
  BaseType BVar4;
  BaseType input_type;
  uint32_t uVar5;
  SPIRType *pSVar6;
  char *op_00;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> pVar7;
  bool local_1ee;
  undefined1 local_1a0 [32];
  undefined1 local_180 [44];
  uint32_t tmp_type_id;
  uint32_t *tmp_id;
  char local_148;
  SPIRExpression *local_140;
  SPIRExpression *ptr;
  undefined1 local_118 [64];
  SPIRType *local_d8;
  SPIRType *mat_type;
  spirv_cross local_b0 [8];
  string expr_1;
  undefined1 local_80 [40];
  string expr;
  BaseType basetype;
  BaseType uint_type;
  BaseType int_type;
  uint32_t integer_width;
  GLSLstd450 op;
  uint32_t count_local;
  uint32_t *args_local;
  float local_18;
  uint32_t eop_local;
  uint32_t id_local;
  uint32_t result_type_local;
  CompilerMSL *this_local;
  
  local_18 = (float)id;
  eop_local = result_type;
  _id_local = this;
  uVar3 = CompilerGLSL::get_integer_width_for_glsl_instruction
                    (&this->super_CompilerGLSL,eop,args,count);
  BVar4 = to_signed_basetype(uVar3);
  input_type = to_unsigned_basetype(uVar3);
  uVar3 = (uint32_t)this;
  switch(eop) {
  case 2:
    CompilerGLSL::emit_unary_func_op
              (&this->super_CompilerGLSL,eop_local,(uint32_t)local_18,*args,"rint");
    break;
  default:
    CompilerGLSL::emit_glsl_op
              (&this->super_CompilerGLSL,eop_local,(uint32_t)local_18,eop,args,count);
    break;
  case 0x19:
    CompilerGLSL::emit_binary_func_op
              (&this->super_CompilerGLSL,eop_local,(uint32_t)local_18,*args,args[1],"atan2");
    break;
  case 0x20:
    CompilerGLSL::emit_unary_func_op
              (&this->super_CompilerGLSL,eop_local,(uint32_t)local_18,*args,"rsqrt");
    break;
  case 0x22:
    local_d8 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,eop_local);
    uVar3 = local_d8->columns;
    if (uVar3 == 2) {
      CompilerGLSL::emit_unary_func_op
                (&this->super_CompilerGLSL,eop_local,(uint32_t)local_18,*args,"spvInverse2x2");
    }
    else if (uVar3 == 3) {
      CompilerGLSL::emit_unary_func_op
                (&this->super_CompilerGLSL,eop_local,(uint32_t)local_18,*args,"spvInverse3x3");
    }
    else if (uVar3 == 4) {
      CompilerGLSL::emit_unary_func_op
                (&this->super_CompilerGLSL,eop_local,(uint32_t)local_18,*args,"spvInverse4x4");
    }
    break;
  case 0x23:
  case 0x33:
    local_140 = Compiler::maybe_get<spirv_cross::SPIRExpression>((Compiler *)this,args[1]);
    if ((local_140 != (SPIRExpression *)0x0) && ((local_140->access_chain & 1U) != 0)) {
      pSVar6 = Compiler::expression_type((Compiler *)this,args[1]);
      bVar2 = Compiler::is_scalar((Compiler *)this,pSVar6);
      if (bVar2) {
        CompilerGLSL::register_call_out_argument(&this->super_CompilerGLSL,args[1]);
        pVar7 = ::std::
                unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                ::insert(&(this->super_CompilerGLSL).super_Compiler.forced_temporaries,
                         (value_type *)&local_18);
        tmp_id = (uint32_t *)pVar7.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
        local_148 = pVar7.second;
        register0x00000000 =
             (Variant *)
             ::std::
             unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             ::operator[](&(this->super_CompilerGLSL).extra_sub_expressions,(key_type *)&local_18);
        if (*(mapped_type *)&register0x00000000->group == 0) {
          uVar5 = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,1);
          *(uint32_t *)&stack0xfffffffffffffea8->group = uVar5;
        }
        uVar5 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_140->expression_type);
        local_180._36_4_ = Compiler::get_pointee_type_id((Compiler *)this,uVar5);
        CompilerGLSL::emit_uninitialized_temporary_expression
                  (&this->super_CompilerGLSL,local_180._36_4_,
                   *(uint32_t *)&stack0xfffffffffffffea8->group);
        op_00 = "frexp";
        if (eop == 0x23) {
          op_00 = "modf";
        }
        CompilerGLSL::emit_binary_func_op
                  (&this->super_CompilerGLSL,eop_local,(uint32_t)local_18,*args,
                   *(uint32_t *)&stack0xfffffffffffffea8->group,op_00);
        CompilerGLSL::to_expression_abi_cxx11_((CompilerGLSL *)local_180,uVar3,SUB41(args[1],0));
        CompilerGLSL::to_expression_abi_cxx11_
                  ((CompilerGLSL *)local_1a0,uVar3,
                   SUB41(*(mapped_type *)&stack0xfffffffffffffea8->group,0));
        CompilerGLSL::
        statement<std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
                  (&this->super_CompilerGLSL,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180,
                   (char (*) [4])0x4f38c2,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0,
                   (char (*) [2])0x4d9ce2);
        ::std::__cxx11::string::~string((string *)local_1a0);
        ::std::__cxx11::string::~string((string *)local_180);
        return;
      }
    }
    CompilerGLSL::emit_glsl_op
              (&this->super_CompilerGLSL,eop_local,(uint32_t)local_18,eop,args,count);
    break;
  case 0x25:
    pSVar6 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,eop_local);
    if (*(int *)&(pSVar6->super_IVariant).field_0xc == 0xd) {
      CompilerGLSL::emit_binary_func_op
                (&this->super_CompilerGLSL,eop_local,(uint32_t)local_18,*args,args[1],"fast::min");
    }
    else {
      CompilerGLSL::emit_binary_func_op
                (&this->super_CompilerGLSL,eop_local,(uint32_t)local_18,*args,args[1],"min");
    }
    break;
  case 0x28:
    pSVar6 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,eop_local);
    if (*(int *)&(pSVar6->super_IVariant).field_0xc == 0xd) {
      CompilerGLSL::emit_binary_func_op
                (&this->super_CompilerGLSL,eop_local,(uint32_t)local_18,*args,args[1],"fast::max");
    }
    else {
      CompilerGLSL::emit_binary_func_op
                (&this->super_CompilerGLSL,eop_local,(uint32_t)local_18,*args,args[1],"max");
    }
    break;
  case 0x2b:
    pSVar6 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,eop_local);
    if (*(int *)&(pSVar6->super_IVariant).field_0xc == 0xd) {
      CompilerGLSL::emit_trinary_func_op
                (&this->super_CompilerGLSL,eop_local,(uint32_t)local_18,*args,args[1],args[2],
                 "fast::clamp");
    }
    else {
      CompilerGLSL::emit_trinary_func_op
                (&this->super_CompilerGLSL,eop_local,(uint32_t)local_18,*args,args[1],args[2],
                 "clamp");
    }
    break;
  case 0x36:
    CompilerGLSL::emit_unary_func_op
              (&this->super_CompilerGLSL,eop_local,(uint32_t)local_18,*args,"pack_float_to_snorm4x8"
              );
    break;
  case 0x37:
    CompilerGLSL::emit_unary_func_op
              (&this->super_CompilerGLSL,eop_local,(uint32_t)local_18,*args,"pack_float_to_unorm4x8"
              );
    break;
  case 0x38:
    CompilerGLSL::emit_unary_func_op
              (&this->super_CompilerGLSL,eop_local,(uint32_t)local_18,*args,
               "pack_float_to_snorm2x16");
    break;
  case 0x39:
    CompilerGLSL::emit_unary_func_op
              (&this->super_CompilerGLSL,eop_local,(uint32_t)local_18,*args,
               "pack_float_to_unorm2x16");
    break;
  case 0x3a:
    CompilerGLSL::to_expression_abi_cxx11_((CompilerGLSL *)local_80,uVar3,SUB41(*args,0));
    join<char_const(&)[21],std::__cxx11::string,char_const(&)[3]>
              ((spirv_cross *)(local_80 + 0x20),(char (*) [21])"as_type<uint>(half2(",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
               (char (*) [3])0x4ef9b3);
    ::std::__cxx11::string::~string((string *)local_80);
    uVar3 = eop_local;
    fVar1 = local_18;
    bVar2 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,*args);
    CompilerGLSL::emit_op
              (&this->super_CompilerGLSL,uVar3,(uint32_t)fVar1,(string *)(local_80 + 0x20),bVar2,
               false);
    Compiler::inherit_expression_dependencies((Compiler *)this,(uint32_t)local_18,*args);
    ::std::__cxx11::string::~string((string *)(local_80 + 0x20));
    break;
  case 0x3b:
    CompilerGLSL::emit_unary_func_op
              (&this->super_CompilerGLSL,eop_local,(uint32_t)local_18,*args,
               "unsupported_GLSLstd450PackDouble2x32");
    break;
  case 0x3c:
    CompilerGLSL::emit_unary_func_op
              (&this->super_CompilerGLSL,eop_local,(uint32_t)local_18,*args,
               "unpack_snorm2x16_to_float");
    break;
  case 0x3d:
    CompilerGLSL::emit_unary_func_op
              (&this->super_CompilerGLSL,eop_local,(uint32_t)local_18,*args,
               "unpack_unorm2x16_to_float");
    break;
  case 0x3e:
    CompilerGLSL::to_expression_abi_cxx11_((CompilerGLSL *)&mat_type,uVar3,SUB41(*args,0));
    join<char_const(&)[23],std::__cxx11::string,char_const(&)[3]>
              (local_b0,(char (*) [23])"float2(as_type<half2>(",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mat_type,
               (char (*) [3])0x4ef9b3);
    ::std::__cxx11::string::~string((string *)&mat_type);
    uVar3 = eop_local;
    fVar1 = local_18;
    bVar2 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,*args);
    CompilerGLSL::emit_op
              (&this->super_CompilerGLSL,uVar3,(uint32_t)fVar1,(string *)local_b0,bVar2,false);
    Compiler::inherit_expression_dependencies((Compiler *)this,(uint32_t)local_18,*args);
    ::std::__cxx11::string::~string((string *)local_b0);
    break;
  case 0x3f:
    CompilerGLSL::emit_unary_func_op
              (&this->super_CompilerGLSL,eop_local,(uint32_t)local_18,*args,
               "unpack_snorm4x8_to_float");
    break;
  case 0x40:
    CompilerGLSL::emit_unary_func_op
              (&this->super_CompilerGLSL,eop_local,(uint32_t)local_18,*args,
               "unpack_unorm4x8_to_float");
    break;
  case 0x41:
    CompilerGLSL::emit_unary_func_op
              (&this->super_CompilerGLSL,eop_local,(uint32_t)local_18,*args,
               "unsupported_GLSLstd450UnpackDouble2x32");
    break;
  case 0x42:
    pSVar6 = Compiler::expression_type((Compiler *)this,*args);
    if (pSVar6->vecsize == 1) {
      CompilerGLSL::emit_unary_func_op
                (&this->super_CompilerGLSL,eop_local,(uint32_t)local_18,*args,"abs");
    }
    else {
      CompilerGLSL::emit_glsl_op
                (&this->super_CompilerGLSL,eop_local,(uint32_t)local_18,eop,args,count);
    }
    break;
  case 0x43:
    pSVar6 = Compiler::expression_type((Compiler *)this,*args);
    uVar5 = eop_local;
    fVar1 = local_18;
    if (pSVar6->vecsize == 1) {
      CompilerGLSL::to_enclosed_unpacked_expression_abi_cxx11_
                ((CompilerGLSL *)local_118,uVar3,SUB41(*args,0));
      CompilerGLSL::to_enclosed_unpacked_expression_abi_cxx11_
                ((CompilerGLSL *)&ptr,uVar3,SUB41(args[1],0));
      join<char_const(&)[5],std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
                ((spirv_cross *)(local_118 + 0x20),(char (*) [5])"abs(",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118,
                 (char (*) [4])0x4f3de1,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ptr,
                 (char (*) [2])0x4dff7a);
      bVar2 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,*args);
      local_1ee = false;
      if (bVar2) {
        local_1ee = CompilerGLSL::should_forward(&this->super_CompilerGLSL,args[1]);
      }
      CompilerGLSL::emit_op
                (&this->super_CompilerGLSL,uVar5,(uint32_t)fVar1,(string *)(local_118 + 0x20),
                 local_1ee,false);
      ::std::__cxx11::string::~string((string *)(local_118 + 0x20));
      ::std::__cxx11::string::~string((string *)&ptr);
      ::std::__cxx11::string::~string((string *)local_118);
      Compiler::inherit_expression_dependencies((Compiler *)this,(uint32_t)local_18,*args);
      Compiler::inherit_expression_dependencies((Compiler *)this,(uint32_t)local_18,args[1]);
    }
    else {
      CompilerGLSL::emit_glsl_op
                (&this->super_CompilerGLSL,eop_local,(uint32_t)local_18,eop,args,count);
    }
    break;
  case 0x45:
    pSVar6 = Compiler::expression_type((Compiler *)this,*args);
    if (pSVar6->vecsize == 1) {
      CompilerGLSL::emit_unary_func_op
                (&this->super_CompilerGLSL,eop_local,(uint32_t)local_18,*args,"sign");
    }
    else {
      CompilerGLSL::emit_glsl_op
                (&this->super_CompilerGLSL,eop_local,(uint32_t)local_18,eop,args,count);
    }
    break;
  case 0x46:
    pSVar6 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,eop_local);
    if (pSVar6->vecsize == 1) {
      CompilerGLSL::emit_trinary_func_op
                (&this->super_CompilerGLSL,eop_local,(uint32_t)local_18,*args,args[1],args[2],
                 "spvFaceForward");
    }
    else {
      CompilerGLSL::emit_glsl_op
                (&this->super_CompilerGLSL,eop_local,(uint32_t)local_18,eop,args,count);
    }
    break;
  case 0x47:
    pSVar6 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,eop_local);
    if (pSVar6->vecsize == 1) {
      CompilerGLSL::emit_binary_func_op
                (&this->super_CompilerGLSL,eop_local,(uint32_t)local_18,*args,args[1],"spvReflect");
    }
    else {
      CompilerGLSL::emit_glsl_op
                (&this->super_CompilerGLSL,eop_local,(uint32_t)local_18,eop,args,count);
    }
    break;
  case 0x48:
    pSVar6 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,eop_local);
    if (pSVar6->vecsize == 1) {
      CompilerGLSL::emit_trinary_func_op
                (&this->super_CompilerGLSL,eop_local,(uint32_t)local_18,*args,args[1],args[2],
                 "spvRefract");
    }
    else {
      CompilerGLSL::emit_glsl_op
                (&this->super_CompilerGLSL,eop_local,(uint32_t)local_18,eop,args,count);
    }
    break;
  case 0x49:
    pSVar6 = Compiler::expression_type((Compiler *)this,*args);
    BVar4 = *(BaseType *)&(pSVar6->super_IVariant).field_0xc;
    CompilerGLSL::emit_unary_func_op_cast
              (&this->super_CompilerGLSL,eop_local,(uint32_t)local_18,*args,"spvFindLSB",BVar4,BVar4
              );
    break;
  case 0x4a:
    CompilerGLSL::emit_unary_func_op_cast
              (&this->super_CompilerGLSL,eop_local,(uint32_t)local_18,*args,"spvFindSMSB",BVar4,
               BVar4);
    break;
  case 0x4b:
    CompilerGLSL::emit_unary_func_op_cast
              (&this->super_CompilerGLSL,eop_local,(uint32_t)local_18,*args,"spvFindUMSB",input_type
               ,input_type);
    break;
  case 0x4f:
    pSVar6 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,eop_local);
    if (*(int *)&(pSVar6->super_IVariant).field_0xc == 0xd) {
      CompilerGLSL::emit_binary_func_op
                (&this->super_CompilerGLSL,eop_local,(uint32_t)local_18,*args,args[1],"precise::min"
                );
    }
    else {
      CompilerGLSL::emit_binary_func_op
                (&this->super_CompilerGLSL,eop_local,(uint32_t)local_18,*args,args[1],"min");
    }
    break;
  case 0x50:
    pSVar6 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,eop_local);
    if (*(int *)&(pSVar6->super_IVariant).field_0xc == 0xd) {
      CompilerGLSL::emit_binary_func_op
                (&this->super_CompilerGLSL,eop_local,(uint32_t)local_18,*args,args[1],"precise::max"
                );
    }
    else {
      CompilerGLSL::emit_binary_func_op
                (&this->super_CompilerGLSL,eop_local,(uint32_t)local_18,*args,args[1],"max");
    }
    break;
  case 0x51:
    pSVar6 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,eop_local);
    if (*(int *)&(pSVar6->super_IVariant).field_0xc == 0xd) {
      CompilerGLSL::emit_trinary_func_op
                (&this->super_CompilerGLSL,eop_local,(uint32_t)local_18,*args,args[1],args[2],
                 "precise::clamp");
    }
    else {
      CompilerGLSL::emit_trinary_func_op
                (&this->super_CompilerGLSL,eop_local,(uint32_t)local_18,*args,args[1],args[2],
                 "clamp");
    }
  }
  return;
}

Assistant:

void CompilerMSL::emit_glsl_op(uint32_t result_type, uint32_t id, uint32_t eop, const uint32_t *args, uint32_t count)
{
	auto op = static_cast<GLSLstd450>(eop);

	// If we need to do implicit bitcasts, make sure we do it with the correct type.
	uint32_t integer_width = get_integer_width_for_glsl_instruction(op, args, count);
	auto int_type = to_signed_basetype(integer_width);
	auto uint_type = to_unsigned_basetype(integer_width);

	switch (op)
	{
	case GLSLstd450Atan2:
		emit_binary_func_op(result_type, id, args[0], args[1], "atan2");
		break;
	case GLSLstd450InverseSqrt:
		emit_unary_func_op(result_type, id, args[0], "rsqrt");
		break;
	case GLSLstd450RoundEven:
		emit_unary_func_op(result_type, id, args[0], "rint");
		break;

	case GLSLstd450FindILsb:
	{
		// In this template version of findLSB, we return T.
		auto basetype = expression_type(args[0]).basetype;
		emit_unary_func_op_cast(result_type, id, args[0], "spvFindLSB", basetype, basetype);
		break;
	}

	case GLSLstd450FindSMsb:
		emit_unary_func_op_cast(result_type, id, args[0], "spvFindSMSB", int_type, int_type);
		break;

	case GLSLstd450FindUMsb:
		emit_unary_func_op_cast(result_type, id, args[0], "spvFindUMSB", uint_type, uint_type);
		break;

	case GLSLstd450PackSnorm4x8:
		emit_unary_func_op(result_type, id, args[0], "pack_float_to_snorm4x8");
		break;
	case GLSLstd450PackUnorm4x8:
		emit_unary_func_op(result_type, id, args[0], "pack_float_to_unorm4x8");
		break;
	case GLSLstd450PackSnorm2x16:
		emit_unary_func_op(result_type, id, args[0], "pack_float_to_snorm2x16");
		break;
	case GLSLstd450PackUnorm2x16:
		emit_unary_func_op(result_type, id, args[0], "pack_float_to_unorm2x16");
		break;

	case GLSLstd450PackHalf2x16:
	{
		auto expr = join("as_type<uint>(half2(", to_expression(args[0]), "))");
		emit_op(result_type, id, expr, should_forward(args[0]));
		inherit_expression_dependencies(id, args[0]);
		break;
	}

	case GLSLstd450UnpackSnorm4x8:
		emit_unary_func_op(result_type, id, args[0], "unpack_snorm4x8_to_float");
		break;
	case GLSLstd450UnpackUnorm4x8:
		emit_unary_func_op(result_type, id, args[0], "unpack_unorm4x8_to_float");
		break;
	case GLSLstd450UnpackSnorm2x16:
		emit_unary_func_op(result_type, id, args[0], "unpack_snorm2x16_to_float");
		break;
	case GLSLstd450UnpackUnorm2x16:
		emit_unary_func_op(result_type, id, args[0], "unpack_unorm2x16_to_float");
		break;

	case GLSLstd450UnpackHalf2x16:
	{
		auto expr = join("float2(as_type<half2>(", to_expression(args[0]), "))");
		emit_op(result_type, id, expr, should_forward(args[0]));
		inherit_expression_dependencies(id, args[0]);
		break;
	}

	case GLSLstd450PackDouble2x32:
		emit_unary_func_op(result_type, id, args[0], "unsupported_GLSLstd450PackDouble2x32"); // Currently unsupported
		break;
	case GLSLstd450UnpackDouble2x32:
		emit_unary_func_op(result_type, id, args[0], "unsupported_GLSLstd450UnpackDouble2x32"); // Currently unsupported
		break;

	case GLSLstd450MatrixInverse:
	{
		auto &mat_type = get<SPIRType>(result_type);
		switch (mat_type.columns)
		{
		case 2:
			emit_unary_func_op(result_type, id, args[0], "spvInverse2x2");
			break;
		case 3:
			emit_unary_func_op(result_type, id, args[0], "spvInverse3x3");
			break;
		case 4:
			emit_unary_func_op(result_type, id, args[0], "spvInverse4x4");
			break;
		default:
			break;
		}
		break;
	}

	case GLSLstd450FMin:
		// If the result type isn't float, don't bother calling the specific
		// precise::/fast:: version. Metal doesn't have those for half and
		// double types.
		if (get<SPIRType>(result_type).basetype != SPIRType::Float)
			emit_binary_func_op(result_type, id, args[0], args[1], "min");
		else
			emit_binary_func_op(result_type, id, args[0], args[1], "fast::min");
		break;

	case GLSLstd450FMax:
		if (get<SPIRType>(result_type).basetype != SPIRType::Float)
			emit_binary_func_op(result_type, id, args[0], args[1], "max");
		else
			emit_binary_func_op(result_type, id, args[0], args[1], "fast::max");
		break;

	case GLSLstd450FClamp:
		// TODO: If args[1] is 0 and args[2] is 1, emit a saturate() call.
		if (get<SPIRType>(result_type).basetype != SPIRType::Float)
			emit_trinary_func_op(result_type, id, args[0], args[1], args[2], "clamp");
		else
			emit_trinary_func_op(result_type, id, args[0], args[1], args[2], "fast::clamp");
		break;

	case GLSLstd450NMin:
		if (get<SPIRType>(result_type).basetype != SPIRType::Float)
			emit_binary_func_op(result_type, id, args[0], args[1], "min");
		else
			emit_binary_func_op(result_type, id, args[0], args[1], "precise::min");
		break;

	case GLSLstd450NMax:
		if (get<SPIRType>(result_type).basetype != SPIRType::Float)
			emit_binary_func_op(result_type, id, args[0], args[1], "max");
		else
			emit_binary_func_op(result_type, id, args[0], args[1], "precise::max");
		break;

	case GLSLstd450NClamp:
		// TODO: If args[1] is 0 and args[2] is 1, emit a saturate() call.
		if (get<SPIRType>(result_type).basetype != SPIRType::Float)
			emit_trinary_func_op(result_type, id, args[0], args[1], args[2], "clamp");
		else
			emit_trinary_func_op(result_type, id, args[0], args[1], args[2], "precise::clamp");
		break;

		// TODO:
		//        GLSLstd450InterpolateAtCentroid (centroid_no_perspective qualifier)
		//        GLSLstd450InterpolateAtSample (sample_no_perspective qualifier)
		//        GLSLstd450InterpolateAtOffset

	case GLSLstd450Distance:
		// MSL does not support scalar versions here.
		if (expression_type(args[0]).vecsize == 1)
		{
			// Equivalent to length(a - b) -> abs(a - b).
			emit_op(result_type, id,
			        join("abs(", to_enclosed_unpacked_expression(args[0]), " - ",
			             to_enclosed_unpacked_expression(args[1]), ")"),
			        should_forward(args[0]) && should_forward(args[1]));
			inherit_expression_dependencies(id, args[0]);
			inherit_expression_dependencies(id, args[1]);
		}
		else
			CompilerGLSL::emit_glsl_op(result_type, id, eop, args, count);
		break;

	case GLSLstd450Length:
		// MSL does not support scalar versions here.
		if (expression_type(args[0]).vecsize == 1)
		{
			// Equivalent to abs().
			emit_unary_func_op(result_type, id, args[0], "abs");
		}
		else
			CompilerGLSL::emit_glsl_op(result_type, id, eop, args, count);
		break;

	case GLSLstd450Normalize:
		// MSL does not support scalar versions here.
		if (expression_type(args[0]).vecsize == 1)
		{
			// Returns -1 or 1 for valid input, sign() does the job.
			emit_unary_func_op(result_type, id, args[0], "sign");
		}
		else
			CompilerGLSL::emit_glsl_op(result_type, id, eop, args, count);
		break;

	case GLSLstd450Reflect:
		if (get<SPIRType>(result_type).vecsize == 1)
			emit_binary_func_op(result_type, id, args[0], args[1], "spvReflect");
		else
			CompilerGLSL::emit_glsl_op(result_type, id, eop, args, count);
		break;

	case GLSLstd450Refract:
		if (get<SPIRType>(result_type).vecsize == 1)
			emit_trinary_func_op(result_type, id, args[0], args[1], args[2], "spvRefract");
		else
			CompilerGLSL::emit_glsl_op(result_type, id, eop, args, count);
		break;

	case GLSLstd450FaceForward:
		if (get<SPIRType>(result_type).vecsize == 1)
			emit_trinary_func_op(result_type, id, args[0], args[1], args[2], "spvFaceForward");
		else
			CompilerGLSL::emit_glsl_op(result_type, id, eop, args, count);
		break;

	case GLSLstd450Modf:
	case GLSLstd450Frexp:
	{
		// Special case. If the variable is a scalar access chain, we cannot use it directly. We have to emit a temporary.
		auto *ptr = maybe_get<SPIRExpression>(args[1]);
		if (ptr && ptr->access_chain && is_scalar(expression_type(args[1])))
		{
			register_call_out_argument(args[1]);
			forced_temporaries.insert(id);

			// Need to create temporaries and copy over to access chain after.
			// We cannot directly take the reference of a vector swizzle in MSL, even if it's scalar ...
			uint32_t &tmp_id = extra_sub_expressions[id];
			if (!tmp_id)
				tmp_id = ir.increase_bound_by(1);

			uint32_t tmp_type_id = get_pointee_type_id(ptr->expression_type);
			emit_uninitialized_temporary_expression(tmp_type_id, tmp_id);
			emit_binary_func_op(result_type, id, args[0], tmp_id, eop == GLSLstd450Modf ? "modf" : "frexp");
			statement(to_expression(args[1]), " = ", to_expression(tmp_id), ";");
		}
		else
			CompilerGLSL::emit_glsl_op(result_type, id, eop, args, count);
		break;
	}

	default:
		CompilerGLSL::emit_glsl_op(result_type, id, eop, args, count);
		break;
	}
}